

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O1

MoveMapOwner __thiscall
gl4cts::BufferStorage::Buffer::MapRange
          (Buffer *this,GLintptr offset,GLsizeiptr length,GLenum access)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLvoid *pGVar4;
  MoveMapOwner MVar5;
  long lVar3;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x40))(this->m_target,this->m_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x284);
  pGVar4 = (GLvoid *)(**(code **)(lVar3 + 0xd00))(this->m_target,offset,length,access);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"MapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x30c);
  MVar5.data = pGVar4;
  MVar5.buffer = this;
  return MVar5;
}

Assistant:

Buffer::MoveMapOwner Buffer::MapRange(glw::GLintptr offset, glw::GLsizeiptr length, glw::GLenum access)
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	Bind(gl, m_id, m_target);

	void* data = MapRange(gl, m_target, offset, length, access);

	MoveMapOwner map(this, data);

	return map;
}